

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.hpp
# Opt level: O0

void __thiscall pearce::ThreadPool::worker(ThreadPool *this)

{
  bool bVar1;
  pointer pIVar2;
  atomic<bool> *in_RDI;
  unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>
  *unaff_retaddr;
  ThreadSafeQueue<std::unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>_>
  *in_stack_00000008;
  unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>
  pTask;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  undefined1 local_10 [16];
  
  while (bVar1 = std::atomic::operator_cast_to_bool(in_RDI), ((bVar1 ^ 0xffU) & 1) != 0) {
    std::
    unique_ptr<pearce::ThreadPool::IThreadTask,std::default_delete<pearce::ThreadPool::IThreadTask>>
    ::unique_ptr<std::default_delete<pearce::ThreadPool::IThreadTask>,void>
              ((unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>
                *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),local_10);
    in_stack_ffffffffffffffd7 =
         ThreadSafeQueue<std::unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>_>
         ::waitPop(in_stack_00000008,unaff_retaddr);
    if ((bool)in_stack_ffffffffffffffd7) {
      pIVar2 = std::
               unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>
               ::operator->((unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>
                             *)0x182df3);
      (*pIVar2->_vptr_IThreadTask[2])();
    }
    std::
    unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>
    ::~unique_ptr((unique_ptr<pearce::ThreadPool::IThreadTask,_std::default_delete<pearce::ThreadPool::IThreadTask>_>
                   *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
  }
  return;
}

Assistant:

void worker(void)
    {
        while (!m_done) {
            std::unique_ptr<IThreadTask> pTask{nullptr};
            if (m_workQueue.waitPop(pTask)) {
                pTask->execute();
            }
        }
    }